

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VDotProdMultiLocal(int nvec,N_Vector x,N_Vector *Y,realtype *dotprods)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  undefined8 uVar1;
  int i;
  undefined4 local_24;
  undefined4 local_4;
  
  if (*(long *)(*(long *)(in_RSI + 8) + 0x180) == 0) {
    if (*(long *)(*(long *)(in_RSI + 8) + 0x138) == 0) {
      local_4 = -1;
    }
    else {
      for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
        uVar1 = (**(code **)(*(long *)(in_RSI + 8) + 0x138))
                          (in_RSI,*(undefined8 *)(in_RDX + (long)local_24 * 8));
        *(undefined8 *)(in_RCX + (long)local_24 * 8) = uVar1;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = (**(code **)(*(long *)(in_RSI + 8) + 0x180))(in_EDI,in_RSI,in_RDX,in_RCX);
  }
  return local_4;
}

Assistant:

int N_VDotProdMultiLocal(int nvec, N_Vector x, N_Vector* Y, realtype* dotprods)
{
  int i;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));

  if (x->ops->nvdotprodmultilocal)
    return((int) x->ops->nvdotprodmultilocal(nvec, x, Y, dotprods));

  if (x->ops->nvdotprodlocal) {
    for (i = 0; i < nvec; i++) {
      dotprods[i] = x->ops->nvdotprodlocal(x, Y[i]);
    }
    return(0);
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return(-1);
}